

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

action __thiscall
Search::search::predictLDF
          (search *this,example *ecs,size_t ec_cnt,ptag mytag,action *oracle_actions,
          size_t oracle_actions_cnt,ptag *condition_on,char *condition_on_names,size_t learner_id,
          float weight)

{
  ulong uVar1;
  pointer *ppuVar2;
  uint uVar3;
  search_private *psVar4;
  iterator __position;
  action_repr *paVar5;
  long lVar6;
  features *pfVar7;
  ulong uVar8;
  action *pos;
  float loss;
  action_repr item;
  action a;
  float a_cost;
  action local_4c;
  Search *local_48;
  ulong local_40;
  float local_34;
  
  local_34 = 0.0;
  pos = oracle_actions;
  local_4c = search_predict(this->priv,ecs,ec_cnt,mytag,oracle_actions,oracle_actions_cnt,
                            condition_on,condition_on_names,(action *)0x0,0,(float *)0x0,learner_id,
                            &local_34,condition_on._0_4_);
  psVar4 = this->priv;
  if (psVar4->state == INIT_TEST) {
    __position._M_current =
         (psVar4->test_action_sequence).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (psVar4->test_action_sequence).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&psVar4->test_action_sequence,
                 __position,&local_4c);
    }
    else {
      *__position._M_current = local_4c;
      ppuVar2 = &(psVar4->test_action_sequence).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar2 = *ppuVar2 + 1;
    }
  }
  if ((mytag != 0) && (ecs[local_4c].l.cs.costs._end != ecs[local_4c].l.cs.costs._begin)) {
    uVar8 = (ulong)mytag;
    paVar5 = (this->priv->ptag_to_action)._begin;
    local_40 = oracle_actions_cnt;
    if (uVar8 < (ulong)((long)(this->priv->ptag_to_action)._end - (long)paVar5 >> 4)) {
      pfVar7 = paVar5[uVar8].repr;
      if (pfVar7 != (features *)0x0) {
        features::delete_v(pfVar7);
        pfVar7 = (this->priv->ptag_to_action)._begin[uVar8].repr;
        if (pfVar7 != (features *)0x0) {
          operator_delete(pfVar7);
        }
      }
    }
    psVar4 = this->priv;
    local_48 = (Search *)&psVar4->ptag_to_action;
    uVar3 = (ecs[local_4c].l.cs.costs._begin)->class_index;
    pfVar7 = (features *)operator_new(0x68);
    (pfVar7->values)._begin = (float *)0x0;
    (pfVar7->values)._end = (float *)0x0;
    (pfVar7->values).end_array = (float *)0x0;
    (pfVar7->values).erase_count = 0;
    (pfVar7->indicies)._begin = (unsigned_long *)0x0;
    (pfVar7->indicies)._end = (unsigned_long *)0x0;
    (pfVar7->indicies).end_array = (unsigned_long *)0x0;
    (pfVar7->indicies).erase_count = 0;
    (pfVar7->space_names)._begin =
         (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (pfVar7->space_names)._end =
         (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (pfVar7->space_names).end_array =
         (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (pfVar7->space_names).erase_count = 0;
    pfVar7->sum_feat_sq = 0.0;
    features::deep_copy_from(pfVar7,&psVar4->last_action_repr);
    item.repr._0_4_ = mytag;
    item._0_8_ = pfVar7;
    item.repr._4_4_ = 0;
    push_at<Search::action_repr>
              (local_48,(v_array<Search::action_repr> *)(ulong)uVar3,item,(size_t)pos);
    oracle_actions_cnt = local_40;
  }
  if (this->priv->auto_hamming_loss == true) {
    loss = 0.0;
    if ((oracle_actions_cnt != 0) && (*oracle_actions != local_4c)) {
      uVar8 = 0;
      do {
        if (oracle_actions_cnt - 1 == uVar8) goto LAB_0025f1e8;
        uVar1 = uVar8 + 1;
        lVar6 = uVar8 + 1;
        uVar8 = uVar1;
      } while (oracle_actions[lVar6] != local_4c);
      if (oracle_actions_cnt <= uVar1) {
LAB_0025f1e8:
        loss = 1.0;
      }
    }
    search_declare_loss(this->priv,loss);
  }
  return local_4c;
}

Assistant:

action search::predictLDF(example* ecs, size_t ec_cnt, ptag mytag, const action* oracle_actions,
    size_t oracle_actions_cnt, const ptag* condition_on, const char* condition_on_names, size_t learner_id,
    float weight)
{
  float a_cost = 0.;
  // TODO: action costs for ldf
  action a = search_predict(*priv, ecs, ec_cnt, mytag, oracle_actions, oracle_actions_cnt, condition_on,
      condition_on_names, nullptr, 0, nullptr, learner_id, a_cost, weight);
  if (priv->state == INIT_TEST)
    priv->test_action_sequence.push_back(a);
  if ((mytag != 0) && ecs[a].l.cs.costs.size() > 0)
  {
    if (mytag < priv->ptag_to_action.size())
    {
      cdbg << "delete_v at " << mytag << endl;
      if (priv->ptag_to_action[mytag].repr != nullptr)
      {
        priv->ptag_to_action[mytag].repr->delete_v();
        delete priv->ptag_to_action[mytag].repr;
      }
    }
    push_at(priv->ptag_to_action, action_repr(ecs[a].l.cs.costs[0].class_index, &(priv->last_action_repr)), mytag);
  }
  if (priv->auto_hamming_loss)
    loss(action_hamming_loss(a, oracle_actions, oracle_actions_cnt));  // TODO: action costs
  cdbg << "predict returning " << a << endl;
  return a;
}